

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

Exception * __thiscall
kj::_::NullableValue<kj::Exception>::emplace<kj::Exception>
          (NullableValue<kj::Exception> *this,Exception *params)

{
  Exception *params_00;
  Exception *params_local;
  NullableValue<kj::Exception> *this_local;
  
  if ((this->isSet & 1U) != 0) {
    this->isSet = false;
    dtor<kj::Exception>(&(this->field_1).value);
  }
  params_00 = fwd<kj::Exception>(params);
  ctor<kj::Exception,kj::Exception>(&(this->field_1).value,params_00);
  this->isSet = true;
  return (Exception *)&this->field_1;
}

Assistant:

inline T& emplace(Params&&... params) {
    if (isSet) {
      isSet = false;
      dtor(value);
    }
    ctor(value, kj::fwd<Params>(params)...);
    isSet = true;
    return value;
  }